

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5SegIterReverseInitPage(Fts5Index *p,Fts5SegIter *pIter)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  u8 *puVar9;
  i64 iDelta;
  uint local_54;
  ulong local_50;
  u8 *local_48;
  Fts5Index *local_40;
  u64 local_38;
  
  iVar1 = p->pConfig->eDetail;
  iVar5 = pIter->pLeaf->szLeaf;
  iVar8 = pIter->iLeafOffset;
  iVar2 = pIter->iEndofDoclist;
  if (iVar5 < pIter->iEndofDoclist) {
    iVar2 = iVar5;
  }
  puVar9 = pIter->pLeaf->p;
  local_50 = 0;
  local_48 = puVar9;
  local_40 = p;
  do {
    local_38 = 0;
    if (iVar1 == 1) {
      iVar5 = iVar8;
      if ((iVar8 < iVar2) && (puVar9[iVar8] == '\0')) {
        lVar6 = (long)iVar8 + 1;
        iVar4 = (int)lVar6;
        iVar5 = iVar4;
        if ((iVar4 < iVar2) && (iVar5 = iVar8 + 2, puVar9[lVar6] != '\0')) {
          iVar5 = iVar4;
        }
      }
    }
    else {
      local_54 = (uint)puVar9[iVar8];
      iVar5 = 1;
      if ((char)puVar9[iVar8] < '\0') {
        iVar5 = sqlite3Fts5GetVarint32(puVar9 + iVar8,&local_54);
        puVar9 = local_48;
      }
      iVar5 = iVar5 + iVar8 + (int)local_54 / 2;
    }
    iVar4 = 3;
    iVar8 = iVar5;
    if (iVar5 < iVar2) {
      bVar3 = sqlite3Fts5GetVarint(puVar9 + iVar5,&local_38);
      pIter->iRowid = pIter->iRowid + local_38;
      iVar8 = (uint)bVar3 + iVar5;
      if (pIter->nRowidOffset <= (int)local_50) {
        lVar6 = (long)pIter->nRowidOffset + 8;
        piVar7 = pIter->aRowidOffset;
        iVar5 = sqlite3_initialize();
        if (iVar5 == 0) {
          piVar7 = (int *)sqlite3Realloc(piVar7,lVar6 * 4);
        }
        else {
          piVar7 = (int *)0x0;
        }
        if (piVar7 == (int *)0x0) {
          local_40->rc = 7;
          iVar4 = 3;
          puVar9 = local_48;
          goto LAB_001b9ab8;
        }
        pIter->aRowidOffset = piVar7;
        pIter->nRowidOffset = (int)lVar6;
      }
      iVar5 = (int)local_50;
      local_50 = (ulong)(iVar5 + 1);
      pIter->aRowidOffset[iVar5] = pIter->iLeafOffset;
      pIter->iLeafOffset = iVar8;
      iVar4 = 0;
      puVar9 = local_48;
    }
LAB_001b9ab8:
    if (iVar4 != 0) {
      pIter->iRowidOffset = (int)local_50;
      fts5SegIterLoadNPos(local_40,pIter);
      return;
    }
  } while( true );
}

Assistant:

static void fts5SegIterReverseInitPage(Fts5Index *p, Fts5SegIter *pIter){
  int eDetail = p->pConfig->eDetail;
  int n = pIter->pLeaf->szLeaf;
  int i = pIter->iLeafOffset;
  u8 *a = pIter->pLeaf->p;
  int iRowidOffset = 0;

  if( n>pIter->iEndofDoclist ){
    n = pIter->iEndofDoclist;
  }

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  while( 1 ){
    i64 iDelta = 0;

    if( eDetail==FTS5_DETAIL_NONE ){
      /* todo */
      if( i<n && a[i]==0 ){
        i++;
        if( i<n && a[i]==0 ) i++;
      }
    }else{
      int nPos;
      int bDummy;
      i += fts5GetPoslistSize(&a[i], &nPos, &bDummy);
      i += nPos;
    }
    if( i>=n ) break;
    i += fts5GetVarint(&a[i], (u64*)&iDelta);
    pIter->iRowid += iDelta;

    /* If necessary, grow the pIter->aRowidOffset[] array. */
    if( iRowidOffset>=pIter->nRowidOffset ){
      int nNew = pIter->nRowidOffset + 8;
      int *aNew = (int*)sqlite3_realloc64(pIter->aRowidOffset,nNew*sizeof(int));
      if( aNew==0 ){
        p->rc = SQLITE_NOMEM;
        break;
      }
      pIter->aRowidOffset = aNew;
      pIter->nRowidOffset = nNew;
    }

    pIter->aRowidOffset[iRowidOffset++] = pIter->iLeafOffset;
    pIter->iLeafOffset = i;
  }
  pIter->iRowidOffset = iRowidOffset;
  fts5SegIterLoadNPos(p, pIter);
}